

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_baryonyx::pnm_observer>
::store_if_better(solver_functor<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_baryonyx::pnm_observer>
                  *this,bit_array *x,double current,long i)

{
  double dVar1;
  
  if ((this->m_best).value < current) {
    bit_array_impl::operator=((bit_array_impl *)&this->m_best,&x->super_bit_array_impl);
    dVar1 = duration(this);
    (this->m_best).duration = dVar1;
    (this->m_best).loop = i;
    (this->m_best).remaining_constraints = 0;
    (this->m_best).value = current;
  }
  return;
}

Assistant:

inline bool
is_better_solution(Float lhs, Float rhs) noexcept
{
    if constexpr (std::is_same_v<Mode, minimize_tag>)
        return lhs < rhs;
    else
        return lhs > rhs;
}